

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O3

bool __thiscall Js::DynamicObject::IsCompatibleForCopy(DynamicObject *this,DynamicObject *from)

{
  long *plVar1;
  char cVar2;
  bool bVar3;
  BOOL BVar4;
  RecyclableObject *pRVar5;
  RecyclableObject *pRVar6;
  char16_t *form;
  
  plVar1 = *(long **)((from->super_RecyclableObject).type.ptr + 1);
  if (*(short *)(*(long *)((this->super_RecyclableObject).type.ptr + 1) + 0x12) ==
      *(short *)((long)plVar1 + 0x12)) {
    cVar2 = (**(code **)(*plVar1 + 0x288))();
    if (cVar2 == '\0') {
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjectCopyPhase);
      if (!bVar3) {
        return false;
      }
      form = L"ObjectCopy: Can\'t copy: from obj does not have copyable type handler\n";
    }
    else {
      bVar3 = HasObjectArray(this);
      if (bVar3) {
        bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjectCopyPhase);
        if (!bVar3) {
          return false;
        }
        form = L"ObjectCopy: Can\'t copy: to obj has object array\n";
      }
      else if (*(short *)(*(long *)((from->super_RecyclableObject).type.ptr + 1) + 10) ==
               *(short *)(*(long *)((this->super_RecyclableObject).type.ptr + 1) + 10)) {
        pRVar5 = RecyclableObject::GetPrototype(&this->super_RecyclableObject);
        pRVar6 = RecyclableObject::GetPrototype(&from->super_RecyclableObject);
        if (pRVar5 == pRVar6) {
          BVar4 = RecyclableObject::IsExternal(&from->super_RecyclableObject);
          if (BVar4 == 0) {
            if ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr ==
                (((((from->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr) {
              return true;
            }
            bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjectCopyPhase);
            if (!bVar3) {
              return false;
            }
            form = L"ObjectCopy: Can\'t copy: from obj is from different ScriptContext\n";
          }
          else {
            bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjectCopyPhase);
            if (!bVar3) {
              return false;
            }
            form = L"ObjectCopy: Can\'t copy: from obj is External\n";
          }
        }
        else {
          bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjectCopyPhase);
          if (!bVar3) {
            return false;
          }
          form = L"ObjectCopy: Can\'t copy: Prototypes don\'t match\n";
        }
      }
      else {
        bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjectCopyPhase);
        if (!bVar3) {
          return false;
        }
        form = L"ObjectCopy: Can\'t copy: Don\'t have same inline slot offset\n";
      }
    }
    Output::Print(form);
  }
  else {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjectCopyPhase);
    if (bVar3) {
      Output::Print(L"ObjectCopy: Can\'t copy: inline slot capacity doesn\'t match, from: %u, to: %u\n"
                    ,(ulong)*(ushort *)
                             (*(long *)((from->super_RecyclableObject).type.ptr + 1) + 0x12),
                    (ulong)*(ushort *)
                            (*(long *)((this->super_RecyclableObject).type.ptr + 1) + 0x12));
      return false;
    }
  }
  return false;
}

Assistant:

bool DynamicObject::IsCompatibleForCopy(DynamicObject* from) const
    {
        if (this->GetTypeHandler()->GetInlineSlotCapacity() != from->GetTypeHandler()->GetInlineSlotCapacity())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: inline slot capacity doesn't match, from: %u, to: %u\n"),
                    from->GetTypeHandler()->GetInlineSlotCapacity(),
                    this->GetTypeHandler()->GetInlineSlotCapacity());
            }
            return false;
        }
        if (!from->GetTypeHandler()->IsObjectCopyable())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: from obj does not have copyable type handler\n"));
            }
            return false;
        }
        if (this->HasObjectArray())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: to obj has object array\n"));
            }
            return false;
        }
        if (from->GetOffsetOfInlineSlots() != this->GetOffsetOfInlineSlots())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: Don't have same inline slot offset\n"));
            }
            return false;
        }
        if (this->GetPrototype() != from->GetPrototype())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: Prototypes don't match\n"));
            }
            return false;
        }
        if (from->IsExternal())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: from obj is External\n"));
            }
            return false;
        }
        if (this->GetScriptContext() != from->GetScriptContext())
        {
            if (PHASE_TRACE1(ObjectCopyPhase))
            {
                Output::Print(_u("ObjectCopy: Can't copy: from obj is from different ScriptContext\n"));
            }
            return false;
        }

        return true;
    }